

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O1

int TRUST_TOKEN_CLIENT_add_key
              (TRUST_TOKEN_CLIENT *ctx,size_t *out_key_index,uint8_t *key,size_t key_len)

{
  ulong uVar1;
  int iVar2;
  int line;
  uint32_t key_id;
  CBS cbs;
  uint32_t local_2c;
  CBS local_28;
  
  uVar1 = ctx->num_keys;
  if ((uVar1 == 6) || (ctx->method->max_keys <= uVar1)) {
    iVar2 = 0x6b;
    line = 0xe7;
  }
  else {
    local_28.data = key;
    local_28.len = key_len;
    iVar2 = CBS_get_u32(&local_28,&local_2c);
    if (iVar2 != 0) {
      iVar2 = (*ctx->method->client_key_from_bytes)
                        (&ctx->keys[uVar1].key,local_28.data,local_28.len);
      if (iVar2 != 0) {
        ctx->keys[uVar1].id = local_2c;
        *out_key_index = ctx->num_keys;
        ctx->num_keys = ctx->num_keys + 1;
        return 1;
      }
    }
    iVar2 = 0x69;
    line = 0xf2;
  }
  ERR_put_error(0x20,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                ,line);
  return 0;
}

Assistant:

int TRUST_TOKEN_CLIENT_add_key(TRUST_TOKEN_CLIENT *ctx, size_t *out_key_index,
                               const uint8_t *key, size_t key_len) {
  if (ctx->num_keys == OPENSSL_ARRAY_SIZE(ctx->keys) ||
      ctx->num_keys >= ctx->method->max_keys) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_TOO_MANY_KEYS);
    return 0;
  }

  struct trust_token_client_key_st *key_s = &ctx->keys[ctx->num_keys];
  CBS cbs;
  CBS_init(&cbs, key, key_len);
  uint32_t key_id;
  if (!CBS_get_u32(&cbs, &key_id) ||
      !ctx->method->client_key_from_bytes(&key_s->key, CBS_data(&cbs),
                                          CBS_len(&cbs))) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }
  key_s->id = key_id;
  *out_key_index = ctx->num_keys;
  ctx->num_keys += 1;
  return 1;
}